

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O1

void __thiscall QTabBarPrivate::layoutTabs(QTabBarPrivate *this)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  QWidget *this_00;
  QWidgetData *pQVar4;
  long lVar5;
  Tab *pTVar6;
  ulong uVar7;
  QWidget *widget;
  int iVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  int iVar12;
  LayoutDirection LVar13;
  QStyle *pQVar14;
  pointer pQVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  pointer pQVar18;
  int iVar19;
  int iVar20;
  ArrowType type;
  int iVar21;
  ulong uVar22;
  uint uVar23;
  int iVar24;
  long in_FS_OFFSET;
  bool bVar25;
  QRect QVar26;
  QStyleOption opt;
  int local_fc;
  undefined1 local_b8 [12];
  Representation RStack_ac;
  undefined1 local_a8 [12];
  Representation RStack_9c;
  QList<QLayoutStruct> local_98;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QPalettePrivate *pQStack_50;
  undefined1 *local_48;
  QObject *pQStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  this->field_0x2d0 = this->field_0x2d0 & 0xfe;
  pQVar4 = this_00->data;
  iVar21 = (pQVar4->crect).x2.m_i;
  iVar24 = (pQVar4->crect).y2.m_i;
  iVar19 = (pQVar4->crect).x1.m_i;
  iVar12 = (pQVar4->crect).y1.m_i;
  uVar23 = this->shape - RoundedWest;
  pQVar14 = QWidget::style(this_00);
  iVar11 = (**(code **)(*(long *)pQVar14 + 0xf0))(pQVar14,5,0,this_00,0);
  local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d.ptr = (QLayoutStruct *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QLayoutStruct>::QList(&local_98,(this->tabList).d.size + 2);
  pQVar15 = QList<QLayoutStruct>::data(&local_98);
  pQVar15->stretch = 0;
  pQVar15->sizeHint = 0;
  pQVar15->maximumSize = 0x7ffff;
  pQVar15->minimumSize = 0;
  pQVar15->expansive = false;
  pQVar15->empty = true;
  pQVar15->spacing = 0;
  uVar1 = *(ushort *)&this->field_0x2d0;
  pQVar15 = QList<QLayoutStruct>::data(&local_98);
  pQVar15->expansive = (iVar11 != 8 && iVar11 != 1) && (uVar1 & 0x20) == 0;
  pQVar15 = QList<QLayoutStruct>::data(&local_98);
  pQVar15->empty = true;
  lVar5 = (this->tabList).d.size;
  if ((uVar23 & 0xfffffffa) == 0) {
    iVar21 = (iVar24 - iVar12) + 1;
    if (lVar5 == 0) {
      iVar24 = 0;
      iVar19 = 1;
      local_fc = 0;
    }
    else {
      iVar19 = 1;
      uVar22 = 0;
      iVar12 = 0;
      iVar24 = 0;
      local_fc = 0;
      do {
        pTVar6 = (this->tabList).d.ptr[uVar22];
        if ((pTVar6->field_0xe4 & 2) != 0) {
          uVar16 = (**(code **)(*(long *)this_00 + 0x1a0))(this_00,uVar22 & 0xffffffff);
          iVar2 = (int)uVar16;
          iVar20 = (int)((ulong)uVar16 >> 0x20);
          (pTVar6->maxRect).x1.m_i = 0;
          (pTVar6->maxRect).y1.m_i = iVar12;
          (pTVar6->maxRect).x2.m_i = iVar2 + -1;
          (pTVar6->maxRect).y2.m_i = iVar20 + iVar12 + -1;
          if (local_fc <= iVar2) {
            local_fc = iVar2;
          }
          uVar16 = (**(code **)(*(long *)this_00 + 0x1a8))(this_00);
          iVar8 = (int)((ulong)uVar16 >> 0x20);
          (pTVar6->minRect).x1.m_i = 0;
          (pTVar6->minRect).y1.m_i = iVar24;
          (pTVar6->minRect).x2.m_i = (int)uVar16 + -1;
          (pTVar6->minRect).y2.m_i = iVar24 + -1 + iVar8;
          pQVar18 = QList<QLayoutStruct>::data(&local_98);
          pQVar15 = pQVar18 + iVar19;
          pQVar15->stretch = 0;
          pQVar15->sizeHint = 0;
          pQVar15->maximumSize = 0x7ffff;
          pQVar15->minimumSize = 0;
          pQVar18[iVar19].expansive = false;
          pQVar18[iVar19].empty = true;
          pQVar18[iVar19].spacing = 0;
          iVar2 = (pTVar6->maxRect).y2.m_i;
          iVar3 = (pTVar6->maxRect).y1.m_i;
          pQVar15 = QList<QLayoutStruct>::data(&local_98);
          pQVar15[iVar19].sizeHint = (iVar2 - iVar3) + 1;
          pQVar15 = QList<QLayoutStruct>::data(&local_98);
          pQVar15[iVar19].minimumSize = iVar8;
          pQVar15 = QList<QLayoutStruct>::data(&local_98);
          pQVar15[iVar19].empty = false;
          pQVar15 = QList<QLayoutStruct>::data(&local_98);
          pQVar15[iVar19].expansive = true;
          if ((this->field_0x2d0 & 0x20) == 0) {
            pQVar15 = QList<QLayoutStruct>::data(&local_98);
            iVar2 = pQVar15[iVar19].sizeHint;
            pQVar15 = QList<QLayoutStruct>::data(&local_98);
            pQVar15[iVar19].maximumSize = iVar2;
          }
          iVar12 = iVar12 + iVar20;
          iVar24 = iVar24 + iVar8;
          iVar19 = iVar19 + 1;
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 < (ulong)(this->tabList).d.size);
    }
  }
  else {
    iVar21 = (iVar21 - iVar19) + 1;
    if (lVar5 == 0) {
      iVar24 = 0;
      iVar19 = 1;
      local_fc = 0;
    }
    else {
      iVar19 = 1;
      uVar22 = 0;
      iVar24 = 0;
      iVar12 = 0;
      local_fc = 0;
      do {
        pTVar6 = (this->tabList).d.ptr[uVar22];
        if ((pTVar6->field_0xe4 & 2) != 0) {
          uVar16 = (**(code **)(*(long *)this_00 + 0x1a0))(this_00,uVar22 & 0xffffffff);
          iVar2 = (int)((ulong)uVar16 >> 0x20);
          (pTVar6->maxRect).x1.m_i = iVar12;
          (pTVar6->maxRect).y1.m_i = 0;
          (pTVar6->maxRect).x2.m_i = iVar12 + (int)uVar16 + -1;
          (pTVar6->maxRect).y2.m_i = iVar2 + -1;
          if (local_fc <= iVar2) {
            local_fc = iVar2;
          }
          uVar17 = (**(code **)(*(long *)this_00 + 0x1a8))(this_00);
          iVar3 = (int)uVar17;
          (pTVar6->minRect).x1.m_i = iVar24;
          (pTVar6->minRect).y1.m_i = 0;
          (pTVar6->minRect).x2.m_i = iVar24 + iVar3 + -1;
          (pTVar6->minRect).y2.m_i = (int)((ulong)uVar17 >> 0x20) + -1;
          pQVar18 = QList<QLayoutStruct>::data(&local_98);
          pQVar15 = pQVar18 + iVar19;
          pQVar15->stretch = 0;
          pQVar15->sizeHint = 0;
          pQVar15->maximumSize = 0x7ffff;
          pQVar15->minimumSize = 0;
          pQVar18[iVar19].expansive = false;
          pQVar18[iVar19].empty = true;
          pQVar18[iVar19].spacing = 0;
          iVar2 = (pTVar6->maxRect).x2.m_i;
          iVar20 = (pTVar6->maxRect).x1.m_i;
          pQVar15 = QList<QLayoutStruct>::data(&local_98);
          pQVar15[iVar19].sizeHint = (iVar2 - iVar20) + 1;
          pQVar15 = QList<QLayoutStruct>::data(&local_98);
          pQVar15[iVar19].minimumSize = iVar3;
          pQVar15 = QList<QLayoutStruct>::data(&local_98);
          pQVar15[iVar19].empty = false;
          pQVar15 = QList<QLayoutStruct>::data(&local_98);
          pQVar15[iVar19].expansive = true;
          if ((this->field_0x2d0 & 0x20) == 0) {
            pQVar15 = QList<QLayoutStruct>::data(&local_98);
            iVar2 = pQVar15[iVar19].sizeHint;
            pQVar15 = QList<QLayoutStruct>::data(&local_98);
            pQVar15[iVar19].maximumSize = iVar2;
          }
          iVar12 = iVar12 + (int)uVar16;
          iVar24 = iVar24 + iVar3;
          iVar19 = iVar19 + 1;
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 < (ulong)(this->tabList).d.size);
    }
  }
  pQVar18 = QList<QLayoutStruct>::data(&local_98);
  pQVar15 = pQVar18 + iVar19;
  pQVar15->stretch = 0;
  pQVar15->sizeHint = 0;
  pQVar15->maximumSize = 0x7ffff;
  pQVar15->minimumSize = 0;
  pQVar18[iVar19].expansive = false;
  pQVar18[iVar19].empty = true;
  pQVar18[iVar19].spacing = 0;
  uVar1 = *(ushort *)&this->field_0x2d0;
  pQVar15 = QList<QLayoutStruct>::data(&local_98);
  pQVar15[iVar19].expansive = (iVar11 != 8 && iVar11 != 2) && (uVar1 & 0x20) == 0;
  pQVar15 = QList<QLayoutStruct>::data(&local_98);
  pQVar15[iVar19].empty = true;
  iVar19 = iVar24;
  if (iVar24 < iVar21) {
    iVar19 = iVar21;
  }
  iVar12 = 0;
  qGeomCalc(&local_98,0,(int)local_98.d.size,0,iVar19,0);
  if ((this->tabList).d.size == 0) {
    bVar25 = true;
  }
  else {
    uVar22 = 0;
    do {
      pTVar6 = (this->tabList).d.ptr[uVar22];
      if ((pTVar6->field_0xe4 & 2) == 0) {
        (pTVar6->rect).x1 = 0;
        (pTVar6->rect).y1 = 0;
        (pTVar6->rect).x2 = -1;
        (pTVar6->rect).y2 = -1;
        iVar12 = iVar12 + 1;
      }
      else {
        iVar11 = ((int)uVar22 - iVar12) + 1;
        iVar19 = local_98.d.ptr[iVar11].pos;
        iVar11 = local_98.d.ptr[iVar11].size;
        if ((uVar23 & 0xfffffffa) == 0) {
          (pTVar6->rect).x1.m_i = 0;
          (pTVar6->rect).y1.m_i = iVar19;
          (pTVar6->rect).x2.m_i = local_fc + -1;
          (pTVar6->rect).y2.m_i = iVar19 + iVar11 + -1;
        }
        else {
          (pTVar6->rect).x1.m_i = iVar19;
          (pTVar6->rect).y1.m_i = 0;
          (pTVar6->rect).x2.m_i = iVar19 + iVar11 + -1;
          (pTVar6->rect).y2.m_i = local_fc + -1;
        }
      }
      uVar22 = uVar22 + 1;
      uVar7 = (this->tabList).d.size;
    } while (uVar22 < uVar7);
    bVar25 = uVar7 == 0;
  }
  if (((iVar24 <= iVar21) || (bVar25)) || ((*(ushort *)&this->field_0x2d0 & 8) == 0)) {
    QWidget::hide((QWidget *)this->rightB);
    QWidget::hide((QWidget *)this->leftB);
  }
  else {
    QVar26 = normalizedScrollRect(this,0);
    widget = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_50 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOption::QStyleOption((QStyleOption *)&local_78,1,0);
    QStyleOption::initFrom((QStyleOption *)&local_78,widget);
    local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffff60 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar14 = QWidget::style(widget);
    _local_a8 = (QRect)(**(code **)(*(long *)pQVar14 + 0xc0))
                                 (pQVar14,0x35,(QStyleOption *)&local_78,widget);
    local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffff50 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar14 = QWidget::style(widget);
    _local_b8 = (QRect)(**(code **)(*(long *)pQVar14 + 0xc0))
                                 (pQVar14,0x36,(QStyleOption *)&local_78,widget);
    pQVar14 = QWidget::style(widget);
    iVar21 = (**(code **)(*(long *)pQVar14 + 0xe0))(pQVar14,0x33,(QStyleOption *)&local_78,widget);
    uVar17 = local_a8._0_8_;
    uVar16 = stack0xffffffffffffff50;
    if ((uVar23 & 0xfffffffa) == 0) {
      RStack_9c.m_i = local_a8._4_4_ + iVar21 + -1;
      local_b8._4_4_ = (RStack_ac.m_i - iVar21) + 1;
      unique0x10001308 = (undefined1 *)uVar16;
      local_a8._0_8_ = uVar17;
      QToolButton::setArrowType(this->leftB,UpArrow);
      type = DownArrow;
    }
    else {
      LVar13 = QWidget::layoutDirection(widget);
      uVar10 = stack0xffffffffffffff60;
      uVar9 = local_a8._0_8_;
      uVar17 = stack0xffffffffffffff50;
      uVar16 = local_b8._0_8_;
      if (LVar13 == RightToLeft) {
        local_b8._8_4_ = iVar21 + -1 + local_b8._0_4_;
        local_a8._0_4_ = (local_a8._8_4_ - iVar21) + 1;
        local_b8._0_8_ = uVar16;
        unique0x10001348 = (undefined1 *)uVar10;
        QToolButton::setArrowType(this->leftB,RightArrow);
        type = LeftArrow;
      }
      else {
        local_a8._8_4_ = iVar21 + -1 + local_a8._0_4_;
        local_b8._0_4_ = (local_b8._8_4_ - iVar21) + 1;
        unique0x10001318 = (undefined1 *)uVar17;
        local_a8._0_8_ = uVar9;
        QToolButton::setArrowType(this->leftB,LeftArrow);
        type = RightArrow;
      }
    }
    QToolButton::setArrowType(this->rightB,type);
    QWidget::setGeometry((QWidget *)this->leftB,(QRect *)local_a8);
    QWidget::setEnabled((QWidget *)this->leftB,false);
    QWidget::show((QWidget *)this->leftB);
    QWidget::setGeometry((QWidget *)this->rightB,(QRect *)local_b8);
    QWidget::setEnabled((QWidget *)this->rightB,QVar26.x2.m_i.m_i + 1 < iVar24 + QVar26.x1.m_i.m_i);
    QWidget::show((QWidget *)this->rightB);
    QStyleOption::~QStyleOption((QStyleOption *)&local_78);
  }
  layoutWidgets(this,0);
  (**(code **)(*(long *)this_00 + 0x1c0))();
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,0x20,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTabBarPrivate::layoutTabs()
{
    Q_Q(QTabBar);
    layoutDirty = false;
    QSize size = q->size();
    int last, available;
    int maxExtent;
    bool vertTabs = verticalTabs(shape);
    int tabChainIndex = 0;
    int hiddenTabs = 0;

    Qt::Alignment tabAlignment = Qt::Alignment(q->style()->styleHint(QStyle::SH_TabBar_Alignment, nullptr, q));
    QList<QLayoutStruct> tabChain(tabList.size() + 2);

    // We put an empty item at the front and back and set its expansive attribute
    // depending on tabAlignment and expanding.
    tabChain[tabChainIndex].init();
    tabChain[tabChainIndex].expansive = (!expanding)
                                        && (tabAlignment != Qt::AlignLeft)
                                        && (tabAlignment != Qt::AlignJustify);
    tabChain[tabChainIndex].empty = true;
    ++tabChainIndex;

    // We now go through our list of tabs and set the minimum size and the size hint
    // This will allow us to elide text if necessary. Since we don't set
    // a maximum size, tabs will EXPAND to fill up the empty space.
    // Since tab widget is rather *ahem* strict about keeping the geometry of the
    // tab bar to its absolute minimum, this won't bleed through, but will show up
    // if you use tab bar on its own (a.k.a. not a bug, but a feature).
    // Update: if expanding is false, we DO set a maximum size to prevent the tabs
    // being wider than necessary.
    if (!vertTabs) {
        int minx = 0;
        int x = 0;
        int maxHeight = 0;
        for (int i = 0; i < tabList.size(); ++i) {
            const auto tab = tabList.at(i);
            if (!tab->visible) {
                ++hiddenTabs;
                continue;
            }
            QSize sz = q->tabSizeHint(i);
            tab->maxRect = QRect(x, 0, sz.width(), sz.height());
            x += sz.width();
            maxHeight = qMax(maxHeight, sz.height());
            sz = q->minimumTabSizeHint(i);
            tab->minRect = QRect(minx, 0, sz.width(), sz.height());
            minx += sz.width();
            tabChain[tabChainIndex].init();
            tabChain[tabChainIndex].sizeHint = tab->maxRect.width();
            tabChain[tabChainIndex].minimumSize = sz.width();
            tabChain[tabChainIndex].empty = false;
            tabChain[tabChainIndex].expansive = true;

            if (!expanding)
                tabChain[tabChainIndex].maximumSize = tabChain[tabChainIndex].sizeHint;
            ++tabChainIndex;
        }

        last = minx;
        available = size.width();
        maxExtent = maxHeight;
    } else {
        int miny = 0;
        int y = 0;
        int maxWidth = 0;
        for (int i = 0; i < tabList.size(); ++i) {
            auto tab = tabList.at(i);
            if (!tab->visible) {
                ++hiddenTabs;
                continue;
            }
            QSize sz = q->tabSizeHint(i);
            tab->maxRect = QRect(0, y, sz.width(), sz.height());
            y += sz.height();
            maxWidth = qMax(maxWidth, sz.width());
            sz = q->minimumTabSizeHint(i);
            tab->minRect = QRect(0, miny, sz.width(), sz.height());
            miny += sz.height();
            tabChain[tabChainIndex].init();
            tabChain[tabChainIndex].sizeHint = tab->maxRect.height();
            tabChain[tabChainIndex].minimumSize = sz.height();
            tabChain[tabChainIndex].empty = false;
            tabChain[tabChainIndex].expansive = true;

            if (!expanding)
                tabChain[tabChainIndex].maximumSize = tabChain[tabChainIndex].sizeHint;
            ++tabChainIndex;
        }

        last = miny;
        available = size.height();
        maxExtent = maxWidth;
    }

    // Mirror our front item.
    tabChain[tabChainIndex].init();
    tabChain[tabChainIndex].expansive = (!expanding)
                                        && (tabAlignment != Qt::AlignRight)
                                        && (tabAlignment != Qt::AlignJustify);
    tabChain[tabChainIndex].empty = true;
    Q_ASSERT(tabChainIndex == tabChain.size() - 1 - hiddenTabs); // add an assert just to make sure.

    // Do the calculation
    qGeomCalc(tabChain, 0, tabChain.size(), 0, qMax(available, last), 0);

    // Use the results
    hiddenTabs = 0;
    for (int i = 0; i < tabList.size(); ++i) {
        auto tab = tabList.at(i);
        if (!tab->visible) {
            tab->rect = QRect();
            ++hiddenTabs;
            continue;
        }
        const QLayoutStruct &lstruct = tabChain.at(i + 1 - hiddenTabs);
        if (!vertTabs)
            tab->rect.setRect(lstruct.pos, 0, lstruct.size, maxExtent);
        else
            tab->rect.setRect(0, lstruct.pos, maxExtent, lstruct.size);
    }

    if (useScrollButtons && tabList.size() && last > available) {
        const QRect scrollRect = normalizedScrollRect(0);

        Q_Q(QTabBar);
        QStyleOption opt;
        opt.initFrom(q);
        QRect scrollButtonLeftRect = q->style()->subElementRect(QStyle::SE_TabBarScrollLeftButton, &opt, q);
        QRect scrollButtonRightRect = q->style()->subElementRect(QStyle::SE_TabBarScrollRightButton, &opt, q);
        int scrollButtonWidth = q->style()->pixelMetric(QStyle::PM_TabBarScrollButtonWidth, &opt, q);

        // Normally SE_TabBarScrollLeftButton should have the same width as PM_TabBarScrollButtonWidth.
        // But if that is not the case, we set the actual button width to PM_TabBarScrollButtonWidth, and
        // use the extra space from SE_TabBarScrollLeftButton as margins towards the tabs.
        if (vertTabs) {
            scrollButtonLeftRect.setHeight(scrollButtonWidth);
            scrollButtonRightRect.setY(scrollButtonRightRect.bottom() + 1 - scrollButtonWidth);
            scrollButtonRightRect.setHeight(scrollButtonWidth);
            leftB->setArrowType(Qt::UpArrow);
            rightB->setArrowType(Qt::DownArrow);
        } else if (q->layoutDirection() == Qt::RightToLeft) {
            scrollButtonRightRect.setWidth(scrollButtonWidth);
            scrollButtonLeftRect.setX(scrollButtonLeftRect.right() + 1 - scrollButtonWidth);
            scrollButtonLeftRect.setWidth(scrollButtonWidth);
            leftB->setArrowType(Qt::RightArrow);
            rightB->setArrowType(Qt::LeftArrow);
        } else {
            scrollButtonLeftRect.setWidth(scrollButtonWidth);
            scrollButtonRightRect.setX(scrollButtonRightRect.right() + 1 - scrollButtonWidth);
            scrollButtonRightRect.setWidth(scrollButtonWidth);
            leftB->setArrowType(Qt::LeftArrow);
            rightB->setArrowType(Qt::RightArrow);
        }

        leftB->setGeometry(scrollButtonLeftRect);
        leftB->setEnabled(false);
        leftB->show();

        rightB->setGeometry(scrollButtonRightRect);
        rightB->setEnabled(last + scrollRect.left() > scrollRect.x() + scrollRect.width());
        rightB->show();
    } else {
        rightB->hide();
        leftB->hide();
    }

    layoutWidgets();
    q->tabLayoutChange();
}